

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

Gia_Man_t * Nf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Nf_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  char *pTitle;
  bool bVar4;
  float w;
  Gia_Man_t *local_48;
  int local_40;
  int local_3c;
  int Id;
  int i;
  Nf_Man_t *p;
  Gia_Man_t *pCls;
  Gia_Man_t *pNew;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  iVar2 = Gia_ManHasChoices(pGia);
  if (iVar2 != 0) {
    pPars->fCoarsen = 0;
  }
  local_48 = pGia;
  if (pPars->fCoarsen != 0) {
    local_48 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p_00 = Nf_StoCreate(local_48,pPars);
  if (p_00 == (Nf_Man_t *)0x0) {
    pGia_local = (Gia_Man_t *)0x0;
  }
  else {
    if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
      printf("Initial ");
      Gia_ManPrintMuxStats(pGia);
      printf("\n");
      printf("Derived ");
      Gia_ManPrintMuxStats(local_48);
      printf("\n");
    }
    Nf_ManPrintInit(p_00);
    Nf_ManComputeCuts(p_00);
    Nf_ManPrintQuit(p_00);
    iVar2 = Scl_ConIsRunning();
    if (iVar2 == 0) {
      local_3c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p_00->pGia->vCis);
        bVar4 = false;
        if (local_3c < iVar2) {
          pGVar1 = p_00->pGia;
          pGVar3 = Gia_ManCi(p_00->pGia,local_3c);
          local_40 = Gia_ObjId(pGVar1,pGVar3);
          bVar4 = local_40 != 0;
        }
        if (!bVar4) break;
        if (p_00->pGia->vInArrs == (Vec_Flt_t *)0x0) {
          w = 0.0;
        }
        else {
          w = Vec_FltEntry(p_00->pGia->vInArrs,local_3c);
        }
        iVar2 = Scl_Flt2Int(w);
        Nf_ObjPrepareCi(p_00,local_40,iVar2);
        local_3c = local_3c + 1;
      }
    }
    else {
      local_3c = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p_00->pGia->vCis);
        bVar4 = false;
        if (local_3c < iVar2) {
          pGVar1 = p_00->pGia;
          pGVar3 = Gia_ManCi(p_00->pGia,local_3c);
          local_40 = Gia_ObjId(pGVar1,pGVar3);
          bVar4 = local_40 != 0;
        }
        if (!bVar4) break;
        iVar2 = Scl_ConGetInArr(local_3c);
        Nf_ObjPrepareCi(p_00,local_40,iVar2);
        local_3c = local_3c + 1;
      }
    }
    p_00->Iter = 0;
    while (p_00->Iter < p_00->pPars->nRounds) {
      Nf_ManComputeMapping(p_00);
      Nf_ManSetMapRefs(p_00);
      pTitle = "Delay";
      if (p_00->Iter != 0) {
        pTitle = "Area ";
      }
      Nf_ManPrintStats(p_00,pTitle);
      p_00->Iter = p_00->Iter + 1;
    }
    p_00->fUseEla = 1;
    while (p_00->Iter < p_00->pPars->nRounds + pPars->nRoundsEla) {
      Nf_ManComputeMappingEla(p_00);
      Nf_ManUpdateStats(p_00);
      Nf_ManPrintStats(p_00,"Ela  ");
      p_00->Iter = p_00->Iter + 1;
    }
    Nf_ManFixPoDrivers(p_00);
    pGia_local = Nf_ManDeriveMapping(p_00);
    Nf_StoDelete(p_00);
  }
  return pGia_local;
}

Assistant:

Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = NULL, * pCls;
    Nf_Man_t * p; int i, Id;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Nf_StoCreate( pCls, pPars );
    if ( p == NULL )
        return NULL;
//    if ( pPars->fVeryVerbose )
//        Nf_StoPrint( p, pPars->fVeryVerbose );
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Nf_ManPrintInit( p );
    Nf_ManComputeCuts( p );
    Nf_ManPrintQuit( p );
    if ( Scl_ConIsRunning() )
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
            Nf_ObjPrepareCi( p, Id, Scl_ConGetInArr(i) );
    }
    else
    {
        Gia_ManForEachCiId( p->pGia, Id, i )
//            Nf_ObjPrepareCi( p, Id, Scl_Flt2Int(p->pGia->vInArrs ? Abc_MaxFloat(0.0, Vec_FltEntry(p->pGia->vInArrs, i)) : 0.0) );
            Nf_ObjPrepareCi( p, Id, Scl_Flt2Int(p->pGia->vInArrs ? Vec_FltEntry(p->pGia->vInArrs, i) : 0.0) );
    }
    for ( p->Iter = 0; p->Iter < p->pPars->nRounds; p->Iter++ )
    {
        Nf_ManComputeMapping( p );
        Nf_ManSetMapRefs( p );
        Nf_ManPrintStats( p, (char *)(p->Iter ? "Area " : "Delay") );
    }

    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
    {
        Nf_ManComputeMappingEla( p );
        Nf_ManUpdateStats( p );
        Nf_ManPrintStats( p, "Ela  " );
    }
    Nf_ManFixPoDrivers( p );
    pNew = Nf_ManDeriveMapping( p );
/*
    if ( pPars->fAreaOnly )
    {
        int Sbm_ManTestSat( void * pMan );
        Sbm_ManTestSat( p );
    }
*/
    Nf_StoDelete( p );
    return pNew;
}